

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O2

void anon_unknown.dwarf_23e1ccc::sha256::Transform(uint32_t *s,uchar *chunk,size_t blocks)

{
  uint32_t a_00;
  uint32_t b_00;
  uint32_t c_00;
  uint32_t uVar1;
  uint32_t e_00;
  uint32_t f_00;
  uint32_t g_00;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  uint32_t uVar22;
  uint32_t uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  int iVar56;
  uint uVar57;
  uint uVar58;
  long in_FS_OFFSET;
  bool bVar59;
  uint32_t h;
  uint32_t g;
  uint32_t f;
  uint32_t e;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  while (bVar59 = blocks != 0, blocks = blocks - 1, bVar59) {
    a_00 = *s;
    b_00 = s[1];
    c_00 = s[2];
    uVar1 = s[3];
    e_00 = s[4];
    f_00 = s[5];
    g_00 = s[6];
    uVar2 = s[7];
    uVar39 = *(uint *)chunk;
    uVar24 = uVar39 >> 0x18 | (uVar39 & 0xff0000) >> 8 | (uVar39 & 0xff00) << 8 | uVar39 << 0x18;
    h = uVar2;
    g = g_00;
    f = f_00;
    e = e_00;
    d = uVar1;
    c = c_00;
    b = b_00;
    a = a_00;
    Round(a_00,b_00,c_00,&d,e_00,f_00,g_00,&h,uVar24 + 0x428a2f98);
    uVar19 = d;
    uVar16 = h;
    uVar39 = *(uint *)((long)chunk + 4);
    uVar54 = uVar39 >> 0x18 | (uVar39 & 0xff0000) >> 8 | (uVar39 & 0xff00) << 8;
    uVar25 = uVar54 | uVar39 << 0x18;
    Round(h,a_00,b_00,&c,d,e_00,f_00,&g,uVar25 + 0x71374491);
    uVar20 = c;
    uVar17 = g;
    uVar40 = *(uint *)((long)chunk + 8);
    uVar55 = uVar40 >> 0x18 | (uVar40 & 0xff0000) >> 8 | (uVar40 & 0xff00) << 8;
    uVar26 = uVar55 | uVar40 << 0x18;
    Round(g,uVar16,a_00,&b,c,uVar19,e_00,&f,uVar26 + 0xb5c0fbcf);
    uVar21 = b;
    uVar18 = f;
    uVar41 = *(uint *)((long)chunk + 0xc);
    uVar3 = uVar41 >> 0x18 | (uVar41 & 0xff0000) >> 8 | (uVar41 & 0xff00) << 8;
    uVar27 = uVar3 | uVar41 << 0x18;
    Round(f,uVar17,uVar16,&a,b,uVar20,uVar19,&e,uVar27 + 0xe9b5dba5);
    uVar22 = a;
    uVar19 = e;
    uVar42 = *(uint *)((long)chunk + 0x10);
    uVar4 = uVar42 >> 0x18 | (uVar42 & 0xff0000) >> 8 | (uVar42 & 0xff00) << 8;
    uVar28 = uVar4 | uVar42 << 0x18;
    Round(e,uVar18,uVar17,&h,a,uVar21,uVar20,&d,uVar28 + 0x3956c25b);
    uVar20 = d;
    uVar16 = h;
    uVar43 = *(uint *)((long)chunk + 0x14);
    uVar5 = uVar43 >> 0x18 | (uVar43 & 0xff0000) >> 8 | (uVar43 & 0xff00) << 8;
    uVar29 = uVar5 | uVar43 << 0x18;
    Round(d,uVar19,uVar18,&g,h,uVar22,uVar21,&c,uVar29 + 0x59f111f1);
    uVar21 = c;
    uVar17 = g;
    uVar44 = *(uint *)((long)chunk + 0x18);
    uVar6 = uVar44 >> 0x18 | (uVar44 & 0xff0000) >> 8 | (uVar44 & 0xff00) << 8;
    uVar30 = uVar6 | uVar44 << 0x18;
    Round(c,uVar20,uVar19,&f,g,uVar16,uVar22,&b,uVar30 + 0x923f82a4);
    uVar22 = b;
    uVar18 = f;
    uVar45 = *(uint *)((long)chunk + 0x1c);
    uVar7 = uVar45 >> 0x18 | (uVar45 & 0xff0000) >> 8 | (uVar45 & 0xff00) << 8;
    uVar31 = uVar7 | uVar45 << 0x18;
    Round(b,uVar21,uVar20,&e,f,uVar17,uVar16,&a,uVar31 + 0xab1c5ed5);
    uVar23 = a;
    uVar19 = e;
    uVar46 = *(uint *)((long)chunk + 0x20);
    uVar8 = uVar46 >> 0x18 | (uVar46 & 0xff0000) >> 8 | (uVar46 & 0xff00) << 8;
    uVar32 = uVar8 | uVar46 << 0x18;
    Round(a,uVar22,uVar21,&d,e,uVar18,uVar17,&h,uVar32 + 0xd807aa98);
    uVar20 = d;
    uVar16 = h;
    uVar47 = *(uint *)((long)chunk + 0x24);
    uVar9 = uVar47 >> 0x18 | (uVar47 & 0xff0000) >> 8 | (uVar47 & 0xff00) << 8;
    uVar33 = uVar9 | uVar47 << 0x18;
    Round(h,uVar23,uVar22,&c,d,uVar19,uVar18,&g,uVar33 + 0x12835b01);
    uVar21 = c;
    uVar17 = g;
    uVar48 = *(uint *)((long)chunk + 0x28);
    uVar10 = uVar48 >> 0x18 | (uVar48 & 0xff0000) >> 8 | (uVar48 & 0xff00) << 8;
    uVar34 = uVar10 | uVar48 << 0x18;
    Round(g,uVar16,uVar23,&b,c,uVar20,uVar19,&f,uVar34 + 0x243185be);
    uVar22 = b;
    uVar18 = f;
    uVar49 = *(uint *)((long)chunk + 0x2c);
    uVar11 = uVar49 >> 0x18 | (uVar49 & 0xff0000) >> 8 | (uVar49 & 0xff00) << 8;
    uVar35 = uVar11 | uVar49 << 0x18;
    Round(f,uVar17,uVar16,&a,b,uVar21,uVar20,&e,uVar35 + 0x550c7dc3);
    uVar23 = a;
    uVar19 = e;
    uVar50 = *(uint *)((long)chunk + 0x30);
    uVar12 = uVar50 >> 0x18 | (uVar50 & 0xff0000) >> 8 | (uVar50 & 0xff00) << 8;
    uVar36 = uVar12 | uVar50 << 0x18;
    Round(e,uVar18,uVar17,&h,a,uVar22,uVar21,&d,uVar36 + 0x72be5d74);
    uVar20 = d;
    uVar16 = h;
    uVar51 = *(uint *)((long)chunk + 0x34);
    uVar13 = uVar51 >> 0x18 | (uVar51 & 0xff0000) >> 8 | (uVar51 & 0xff00) << 8;
    uVar37 = uVar13 | uVar51 << 0x18;
    Round(d,uVar19,uVar18,&g,h,uVar23,uVar22,&c,uVar37 + 0x80deb1fe);
    uVar21 = c;
    uVar17 = g;
    uVar52 = *(uint *)((long)chunk + 0x38);
    uVar14 = uVar52 >> 0x18 | (uVar52 & 0xff0000) >> 8 | (uVar52 & 0xff00) << 8;
    uVar57 = uVar14 | uVar52 << 0x18;
    Round(c,uVar20,uVar19,&f,g,uVar16,uVar23,&b,uVar57 + 0x9bdc06a7);
    uVar22 = b;
    uVar18 = f;
    uVar53 = *(uint *)((long)chunk + 0x3c);
    uVar15 = uVar53 >> 0x18 | (uVar53 & 0xff0000) >> 8 | (uVar53 & 0xff00) << 8;
    uVar58 = uVar15 | uVar53 << 0x18;
    Round(b,uVar21,uVar20,&e,f,uVar17,uVar16,&a,uVar58 + 0xc19bf174);
    uVar23 = a;
    uVar19 = e;
    uVar38 = uVar57 >> 10 ^ (uVar14 << 0xd | uVar57 >> 0x13) ^ (uVar14 << 0xf | uVar57 >> 0x11);
    iVar56 = uVar24 + uVar33 +
             (uVar25 >> 3 ^
             (uVar54 << 0xe | uVar25 >> 0x12) ^ ((uVar39 >> 0x18) << 0x19 | uVar25 >> 7));
    uVar24 = iVar56 + uVar38;
    Round(a,uVar22,uVar21,&d,e,uVar18,uVar17,&h,uVar38 + iVar56 + 0xe49b69c1);
    uVar20 = d;
    uVar16 = h;
    uVar39 = uVar58 >> 10 ^ (uVar15 << 0xd | uVar58 >> 0x13) ^ (uVar15 << 0xf | uVar58 >> 0x11);
    iVar56 = uVar25 + uVar34 +
             (uVar26 >> 3 ^
             (uVar55 << 0xe | uVar26 >> 0x12) ^ ((uVar40 >> 0x18) << 0x19 | uVar26 >> 7));
    uVar25 = iVar56 + uVar39;
    Round(h,uVar23,uVar22,&c,d,uVar19,uVar18,&g,uVar39 + iVar56 + 0xefbe4786);
    uVar21 = c;
    uVar17 = g;
    uVar40 = uVar24 >> 10 ^ (uVar24 * 0x2000 | uVar24 >> 0x13) ^ (uVar24 * 0x8000 | uVar24 >> 0x11);
    iVar56 = uVar26 + uVar35 +
             (uVar27 >> 3 ^
             (uVar3 << 0xe | uVar27 >> 0x12) ^ ((uVar41 >> 0x18) << 0x19 | uVar27 >> 7));
    uVar39 = uVar40 + iVar56;
    Round(g,uVar16,uVar23,&b,c,uVar20,uVar19,&f,uVar40 + iVar56 + 0xfc19dc6);
    uVar22 = b;
    uVar18 = f;
    uVar41 = uVar25 >> 10 ^ (uVar25 * 0x2000 | uVar25 >> 0x13) ^ (uVar25 * 0x8000 | uVar25 >> 0x11);
    iVar56 = uVar27 + uVar36 +
             (uVar28 >> 3 ^
             (uVar4 << 0xe | uVar28 >> 0x12) ^ ((uVar42 >> 0x18) << 0x19 | uVar28 >> 7));
    uVar40 = iVar56 + uVar41;
    Round(f,uVar17,uVar16,&a,b,uVar21,uVar20,&e,uVar41 + iVar56 + 0x240ca1cc);
    uVar23 = a;
    uVar19 = e;
    uVar42 = uVar39 >> 10 ^ (uVar39 * 0x2000 | uVar39 >> 0x13) ^ (uVar39 * 0x8000 | uVar39 >> 0x11);
    iVar56 = uVar28 + uVar37 +
             (uVar29 >> 3 ^
             (uVar5 << 0xe | uVar29 >> 0x12) ^ ((uVar43 >> 0x18) << 0x19 | uVar29 >> 7));
    uVar41 = iVar56 + uVar42;
    Round(e,uVar18,uVar17,&h,a,uVar22,uVar21,&d,uVar42 + iVar56 + 0x2de92c6f);
    uVar20 = d;
    uVar16 = h;
    uVar43 = uVar40 >> 10 ^ (uVar40 * 0x2000 | uVar40 >> 0x13) ^ (uVar40 * 0x8000 | uVar40 >> 0x11);
    iVar56 = uVar29 + uVar57 +
             (uVar30 >> 3 ^
             (uVar6 << 0xe | uVar30 >> 0x12) ^ ((uVar44 >> 0x18) << 0x19 | uVar30 >> 7));
    uVar42 = iVar56 + uVar43;
    Round(d,uVar19,uVar18,&g,h,uVar23,uVar22,&c,uVar43 + iVar56 + 0x4a7484aa);
    uVar21 = c;
    uVar17 = g;
    uVar44 = uVar41 >> 10 ^ (uVar41 * 0x2000 | uVar41 >> 0x13) ^ (uVar41 * 0x8000 | uVar41 >> 0x11);
    iVar56 = uVar30 + uVar58 +
             (uVar31 >> 3 ^
             (uVar7 << 0xe | uVar31 >> 0x12) ^ ((uVar45 >> 0x18) << 0x19 | uVar31 >> 7));
    uVar43 = iVar56 + uVar44;
    Round(c,uVar20,uVar19,&f,g,uVar16,uVar23,&b,uVar44 + iVar56 + 0x5cb0a9dc);
    uVar22 = b;
    uVar18 = f;
    uVar45 = uVar42 >> 10 ^ (uVar42 * 0x2000 | uVar42 >> 0x13) ^ (uVar42 * 0x8000 | uVar42 >> 0x11);
    iVar56 = (uVar32 >> 3 ^
             (uVar8 << 0xe | uVar32 >> 0x12) ^ ((uVar46 >> 0x18) << 0x19 | uVar32 >> 7)) + uVar31 +
             uVar24;
    uVar44 = iVar56 + uVar45;
    Round(b,uVar21,uVar20,&e,f,uVar17,uVar16,&a,uVar45 + iVar56 + 0x76f988da);
    uVar23 = a;
    uVar19 = e;
    uVar46 = uVar43 >> 10 ^ (uVar43 * 0x2000 | uVar43 >> 0x13) ^ (uVar43 * 0x8000 | uVar43 >> 0x11);
    iVar56 = (uVar33 >> 3 ^
             (uVar9 << 0xe | uVar33 >> 0x12) ^ ((uVar47 >> 0x18) << 0x19 | uVar33 >> 7)) + uVar32 +
             uVar25;
    uVar45 = iVar56 + uVar46;
    Round(a,uVar22,uVar21,&d,e,uVar18,uVar17,&h,uVar46 + iVar56 + 0x983e5152);
    uVar20 = d;
    uVar16 = h;
    uVar47 = uVar44 >> 10 ^ (uVar44 * 0x2000 | uVar44 >> 0x13) ^ (uVar44 * 0x8000 | uVar44 >> 0x11);
    iVar56 = (uVar34 >> 3 ^
             (uVar10 << 0xe | uVar34 >> 0x12) ^ ((uVar48 >> 0x18) << 0x19 | uVar34 >> 7)) + uVar33 +
             uVar39;
    uVar46 = iVar56 + uVar47;
    Round(h,uVar23,uVar22,&c,d,uVar19,uVar18,&g,uVar47 + iVar56 + 0xa831c66d);
    uVar21 = c;
    uVar17 = g;
    uVar48 = uVar45 >> 10 ^ (uVar45 * 0x2000 | uVar45 >> 0x13) ^ (uVar45 * 0x8000 | uVar45 >> 0x11);
    iVar56 = (uVar35 >> 3 ^
             (uVar11 << 0xe | uVar35 >> 0x12) ^ ((uVar49 >> 0x18) << 0x19 | uVar35 >> 7)) + uVar34 +
             uVar40;
    uVar47 = iVar56 + uVar48;
    Round(g,uVar16,uVar23,&b,c,uVar20,uVar19,&f,uVar48 + iVar56 + 0xb00327c8);
    uVar22 = b;
    uVar18 = f;
    uVar49 = uVar46 >> 10 ^ (uVar46 * 0x2000 | uVar46 >> 0x13) ^ (uVar46 * 0x8000 | uVar46 >> 0x11);
    iVar56 = (uVar36 >> 3 ^
             (uVar12 << 0xe | uVar36 >> 0x12) ^ ((uVar50 >> 0x18) << 0x19 | uVar36 >> 7)) + uVar35 +
             uVar41;
    uVar48 = iVar56 + uVar49;
    Round(f,uVar17,uVar16,&a,b,uVar21,uVar20,&e,uVar49 + iVar56 + 0xbf597fc7);
    uVar23 = a;
    uVar19 = e;
    uVar50 = uVar47 >> 10 ^ (uVar47 * 0x2000 | uVar47 >> 0x13) ^ (uVar47 * 0x8000 | uVar47 >> 0x11);
    iVar56 = (uVar37 >> 3 ^
             (uVar13 << 0xe | uVar37 >> 0x12) ^ ((uVar51 >> 0x18) << 0x19 | uVar37 >> 7)) + uVar36 +
             uVar42;
    uVar49 = iVar56 + uVar50;
    Round(e,uVar18,uVar17,&h,a,uVar22,uVar21,&d,uVar50 + iVar56 + 0xc6e00bf3);
    uVar20 = d;
    uVar16 = h;
    uVar51 = uVar48 >> 10 ^ (uVar48 * 0x2000 | uVar48 >> 0x13) ^ (uVar48 * 0x8000 | uVar48 >> 0x11);
    iVar56 = (uVar57 >> 3 ^
             (uVar14 << 0xe | uVar57 >> 0x12) ^ ((uVar52 >> 0x18) << 0x19 | uVar57 >> 7)) + uVar37 +
             uVar43;
    uVar50 = iVar56 + uVar51;
    Round(d,uVar19,uVar18,&g,h,uVar23,uVar22,&c,uVar51 + iVar56 + 0xd5a79147);
    uVar21 = c;
    uVar17 = g;
    uVar52 = uVar49 >> 10 ^ (uVar49 * 0x2000 | uVar49 >> 0x13) ^ (uVar49 * 0x8000 | uVar49 >> 0x11);
    iVar56 = (uVar58 >> 3 ^
             (uVar15 << 0xe | uVar58 >> 0x12) ^ ((uVar53 >> 0x18) << 0x19 | uVar58 >> 7)) + uVar57 +
             uVar44;
    uVar51 = iVar56 + uVar52;
    Round(c,uVar20,uVar19,&f,g,uVar16,uVar23,&b,uVar52 + iVar56 + 0x6ca6351);
    uVar22 = b;
    uVar18 = f;
    uVar53 = uVar50 >> 10 ^ (uVar50 * 0x2000 | uVar50 >> 0x13) ^ (uVar50 * 0x8000 | uVar50 >> 0x11);
    iVar56 = (uVar24 >> 3 ^ (uVar24 * 0x4000 | uVar24 >> 0x12) ^ (uVar24 * 0x2000000 | uVar24 >> 7))
             + uVar58 + uVar45;
    uVar52 = iVar56 + uVar53;
    Round(b,uVar21,uVar20,&e,f,uVar17,uVar16,&a,uVar53 + iVar56 + 0x14292967);
    uVar23 = a;
    uVar19 = e;
    uVar54 = uVar51 >> 10 ^ (uVar51 * 0x2000 | uVar51 >> 0x13) ^ (uVar51 * 0x8000 | uVar51 >> 0x11);
    iVar56 = (uVar25 >> 3 ^ (uVar25 * 0x4000 | uVar25 >> 0x12) ^ (uVar25 * 0x2000000 | uVar25 >> 7))
             + uVar24 + uVar46;
    uVar53 = iVar56 + uVar54;
    Round(a,uVar22,uVar21,&d,e,uVar18,uVar17,&h,uVar54 + iVar56 + 0x27b70a85);
    uVar20 = d;
    uVar16 = h;
    uVar55 = uVar52 >> 10 ^ (uVar52 * 0x2000 | uVar52 >> 0x13) ^ (uVar52 * 0x8000 | uVar52 >> 0x11);
    iVar56 = (uVar39 >> 3 ^ (uVar39 * 0x4000 | uVar39 >> 0x12) ^ (uVar39 * 0x2000000 | uVar39 >> 7))
             + uVar25 + uVar47;
    uVar54 = iVar56 + uVar55;
    Round(h,uVar23,uVar22,&c,d,uVar19,uVar18,&g,uVar55 + iVar56 + 0x2e1b2138);
    uVar21 = c;
    uVar17 = g;
    uVar55 = uVar53 >> 10 ^ (uVar53 * 0x2000 | uVar53 >> 0x13) ^ (uVar53 * 0x8000 | uVar53 >> 0x11);
    iVar56 = (uVar40 >> 3 ^ (uVar40 * 0x4000 | uVar40 >> 0x12) ^ (uVar40 * 0x2000000 | uVar40 >> 7))
             + uVar39 + uVar48;
    uVar39 = iVar56 + uVar55;
    Round(g,uVar16,uVar23,&b,c,uVar20,uVar19,&f,uVar55 + iVar56 + 0x4d2c6dfc);
    uVar22 = b;
    uVar18 = f;
    uVar55 = uVar54 >> 10 ^ (uVar54 * 0x2000 | uVar54 >> 0x13) ^ (uVar54 * 0x8000 | uVar54 >> 0x11);
    iVar56 = (uVar41 >> 3 ^ (uVar41 * 0x4000 | uVar41 >> 0x12) ^ (uVar41 * 0x2000000 | uVar41 >> 7))
             + uVar40 + uVar49;
    uVar40 = iVar56 + uVar55;
    Round(f,uVar17,uVar16,&a,b,uVar21,uVar20,&e,uVar55 + iVar56 + 0x53380d13);
    uVar23 = a;
    uVar19 = e;
    uVar55 = uVar39 >> 10 ^ (uVar39 * 0x2000 | uVar39 >> 0x13) ^ (uVar39 * 0x8000 | uVar39 >> 0x11);
    iVar56 = (uVar42 >> 3 ^ (uVar42 * 0x4000 | uVar42 >> 0x12) ^ (uVar42 * 0x2000000 | uVar42 >> 7))
             + uVar41 + uVar50;
    uVar41 = iVar56 + uVar55;
    Round(e,uVar18,uVar17,&h,a,uVar22,uVar21,&d,uVar55 + iVar56 + 0x650a7354);
    uVar20 = d;
    uVar16 = h;
    uVar55 = uVar40 >> 10 ^ (uVar40 * 0x2000 | uVar40 >> 0x13) ^ (uVar40 * 0x8000 | uVar40 >> 0x11);
    iVar56 = (uVar43 >> 3 ^ (uVar43 * 0x4000 | uVar43 >> 0x12) ^ (uVar43 * 0x2000000 | uVar43 >> 7))
             + uVar42 + uVar51;
    uVar42 = iVar56 + uVar55;
    Round(d,uVar19,uVar18,&g,h,uVar23,uVar22,&c,uVar55 + iVar56 + 0x766a0abb);
    uVar21 = c;
    uVar17 = g;
    uVar55 = uVar41 >> 10 ^ (uVar41 * 0x2000 | uVar41 >> 0x13) ^ (uVar41 * 0x8000 | uVar41 >> 0x11);
    iVar56 = (uVar44 >> 3 ^ (uVar44 * 0x4000 | uVar44 >> 0x12) ^ (uVar44 * 0x2000000 | uVar44 >> 7))
             + uVar43 + uVar52;
    uVar43 = iVar56 + uVar55;
    Round(c,uVar20,uVar19,&f,g,uVar16,uVar23,&b,uVar55 + iVar56 + 0x81c2c92e);
    uVar22 = b;
    uVar18 = f;
    uVar55 = uVar42 >> 10 ^ (uVar42 * 0x2000 | uVar42 >> 0x13) ^ (uVar42 * 0x8000 | uVar42 >> 0x11);
    iVar56 = (uVar45 >> 3 ^ (uVar45 * 0x4000 | uVar45 >> 0x12) ^ (uVar45 * 0x2000000 | uVar45 >> 7))
             + uVar44 + uVar53;
    uVar44 = iVar56 + uVar55;
    Round(b,uVar21,uVar20,&e,f,uVar17,uVar16,&a,uVar55 + iVar56 + 0x92722c85);
    uVar23 = a;
    uVar19 = e;
    uVar55 = uVar43 >> 10 ^ (uVar43 * 0x2000 | uVar43 >> 0x13) ^ (uVar43 * 0x8000 | uVar43 >> 0x11);
    iVar56 = (uVar46 >> 3 ^ (uVar46 * 0x4000 | uVar46 >> 0x12) ^ (uVar46 * 0x2000000 | uVar46 >> 7))
             + uVar45 + uVar54;
    uVar45 = iVar56 + uVar55;
    Round(a,uVar22,uVar21,&d,e,uVar18,uVar17,&h,uVar55 + iVar56 + 0xa2bfe8a1);
    uVar20 = d;
    uVar16 = h;
    uVar55 = uVar44 >> 10 ^ (uVar44 * 0x2000 | uVar44 >> 0x13) ^ (uVar44 * 0x8000 | uVar44 >> 0x11);
    iVar56 = (uVar47 >> 3 ^ (uVar47 * 0x4000 | uVar47 >> 0x12) ^ (uVar47 * 0x2000000 | uVar47 >> 7))
             + uVar46 + uVar39;
    uVar46 = iVar56 + uVar55;
    Round(h,uVar23,uVar22,&c,d,uVar19,uVar18,&g,uVar55 + iVar56 + 0xa81a664b);
    uVar21 = c;
    uVar17 = g;
    uVar55 = uVar45 >> 10 ^ (uVar45 * 0x2000 | uVar45 >> 0x13) ^ (uVar45 * 0x8000 | uVar45 >> 0x11);
    iVar56 = (uVar48 >> 3 ^ (uVar48 * 0x4000 | uVar48 >> 0x12) ^ (uVar48 * 0x2000000 | uVar48 >> 7))
             + uVar47 + uVar40;
    uVar47 = iVar56 + uVar55;
    Round(g,uVar16,uVar23,&b,c,uVar20,uVar19,&f,uVar55 + iVar56 + 0xc24b8b70);
    uVar22 = b;
    uVar18 = f;
    uVar55 = uVar46 >> 10 ^ (uVar46 * 0x2000 | uVar46 >> 0x13) ^ (uVar46 * 0x8000 | uVar46 >> 0x11);
    iVar56 = (uVar49 >> 3 ^ (uVar49 * 0x4000 | uVar49 >> 0x12) ^ (uVar49 * 0x2000000 | uVar49 >> 7))
             + uVar48 + uVar41;
    uVar48 = iVar56 + uVar55;
    Round(f,uVar17,uVar16,&a,b,uVar21,uVar20,&e,uVar55 + iVar56 + 0xc76c51a3);
    uVar23 = a;
    uVar19 = e;
    uVar55 = uVar47 >> 10 ^ (uVar47 * 0x2000 | uVar47 >> 0x13) ^ (uVar47 * 0x8000 | uVar47 >> 0x11);
    iVar56 = (uVar50 >> 3 ^ (uVar50 * 0x4000 | uVar50 >> 0x12) ^ (uVar50 * 0x2000000 | uVar50 >> 7))
             + uVar49 + uVar42;
    uVar49 = iVar56 + uVar55;
    Round(e,uVar18,uVar17,&h,a,uVar22,uVar21,&d,uVar55 + iVar56 + 0xd192e819);
    uVar20 = d;
    uVar16 = h;
    uVar55 = uVar48 >> 10 ^ (uVar48 * 0x2000 | uVar48 >> 0x13) ^ (uVar48 * 0x8000 | uVar48 >> 0x11);
    iVar56 = (uVar51 >> 3 ^ (uVar51 * 0x4000 | uVar51 >> 0x12) ^ (uVar51 * 0x2000000 | uVar51 >> 7))
             + uVar50 + uVar43;
    uVar50 = iVar56 + uVar55;
    Round(d,uVar19,uVar18,&g,h,uVar23,uVar22,&c,uVar55 + iVar56 + 0xd6990624);
    uVar21 = c;
    uVar17 = g;
    uVar55 = uVar49 >> 10 ^ (uVar49 * 0x2000 | uVar49 >> 0x13) ^ (uVar49 * 0x8000 | uVar49 >> 0x11);
    iVar56 = (uVar52 >> 3 ^ (uVar52 * 0x4000 | uVar52 >> 0x12) ^ (uVar52 * 0x2000000 | uVar52 >> 7))
             + uVar51 + uVar44;
    uVar51 = iVar56 + uVar55;
    Round(c,uVar20,uVar19,&f,g,uVar16,uVar23,&b,uVar55 + iVar56 + 0xf40e3585);
    uVar22 = b;
    uVar18 = f;
    uVar55 = uVar50 >> 10 ^ (uVar50 * 0x2000 | uVar50 >> 0x13) ^ (uVar50 * 0x8000 | uVar50 >> 0x11);
    iVar56 = (uVar53 >> 3 ^ (uVar53 * 0x4000 | uVar53 >> 0x12) ^ (uVar53 * 0x2000000 | uVar53 >> 7))
             + uVar52 + uVar45;
    uVar52 = iVar56 + uVar55;
    Round(b,uVar21,uVar20,&e,f,uVar17,uVar16,&a,uVar55 + iVar56 + 0x106aa070);
    uVar23 = a;
    uVar19 = e;
    uVar55 = uVar51 >> 10 ^ (uVar51 * 0x2000 | uVar51 >> 0x13) ^ (uVar51 * 0x8000 | uVar51 >> 0x11);
    iVar56 = (uVar54 >> 3 ^ (uVar54 * 0x4000 | uVar54 >> 0x12) ^ (uVar54 * 0x2000000 | uVar54 >> 7))
             + uVar53 + uVar46;
    uVar53 = iVar56 + uVar55;
    Round(a,uVar22,uVar21,&d,e,uVar18,uVar17,&h,uVar55 + iVar56 + 0x19a4c116);
    uVar20 = d;
    uVar16 = h;
    uVar55 = uVar52 >> 10 ^ (uVar52 * 0x2000 | uVar52 >> 0x13) ^ (uVar52 * 0x8000 | uVar52 >> 0x11);
    iVar56 = (uVar39 >> 3 ^ (uVar39 * 0x4000 | uVar39 >> 0x12) ^ (uVar39 * 0x2000000 | uVar39 >> 7))
             + uVar54 + uVar47;
    uVar54 = iVar56 + uVar55;
    Round(h,uVar23,uVar22,&c,d,uVar19,uVar18,&g,uVar55 + iVar56 + 0x1e376c08);
    uVar21 = c;
    uVar17 = g;
    uVar55 = uVar53 >> 10 ^ (uVar53 * 0x2000 | uVar53 >> 0x13) ^ (uVar53 * 0x8000 | uVar53 >> 0x11);
    iVar56 = (uVar40 >> 3 ^ (uVar40 * 0x4000 | uVar40 >> 0x12) ^ (uVar40 * 0x2000000 | uVar40 >> 7))
             + uVar39 + uVar48;
    uVar39 = iVar56 + uVar55;
    Round(g,uVar16,uVar23,&b,c,uVar20,uVar19,&f,uVar55 + iVar56 + 0x2748774c);
    uVar22 = b;
    uVar18 = f;
    uVar55 = uVar54 >> 10 ^ (uVar54 * 0x2000 | uVar54 >> 0x13) ^ (uVar54 * 0x8000 | uVar54 >> 0x11);
    iVar56 = (uVar41 >> 3 ^ (uVar41 * 0x4000 | uVar41 >> 0x12) ^ (uVar41 * 0x2000000 | uVar41 >> 7))
             + uVar40 + uVar49;
    uVar40 = iVar56 + uVar55;
    Round(f,uVar17,uVar16,&a,b,uVar21,uVar20,&e,uVar55 + iVar56 + 0x34b0bcb5);
    uVar23 = a;
    uVar19 = e;
    uVar55 = uVar39 >> 10 ^ (uVar39 * 0x2000 | uVar39 >> 0x13) ^ (uVar39 * 0x8000 | uVar39 >> 0x11);
    iVar56 = (uVar42 >> 3 ^ (uVar42 * 0x4000 | uVar42 >> 0x12) ^ (uVar42 * 0x2000000 | uVar42 >> 7))
             + uVar41 + uVar50;
    uVar41 = iVar56 + uVar55;
    Round(e,uVar18,uVar17,&h,a,uVar22,uVar21,&d,uVar55 + iVar56 + 0x391c0cb3);
    uVar20 = d;
    uVar16 = h;
    uVar55 = uVar40 >> 10 ^ (uVar40 * 0x2000 | uVar40 >> 0x13) ^ (uVar40 * 0x8000 | uVar40 >> 0x11);
    iVar56 = (uVar43 >> 3 ^ (uVar43 * 0x4000 | uVar43 >> 0x12) ^ (uVar43 * 0x2000000 | uVar43 >> 7))
             + uVar42 + uVar51;
    uVar42 = iVar56 + uVar55;
    Round(d,uVar19,uVar18,&g,h,uVar23,uVar22,&c,uVar55 + iVar56 + 0x4ed8aa4a);
    uVar21 = c;
    uVar17 = g;
    uVar55 = uVar41 >> 10 ^ (uVar41 * 0x2000 | uVar41 >> 0x13) ^ (uVar41 * 0x8000 | uVar41 >> 0x11);
    iVar56 = (uVar44 >> 3 ^ (uVar44 * 0x4000 | uVar44 >> 0x12) ^ (uVar44 * 0x2000000 | uVar44 >> 7))
             + uVar43 + uVar52;
    uVar43 = iVar56 + uVar55;
    Round(c,uVar20,uVar19,&f,g,uVar16,uVar23,&b,uVar55 + iVar56 + 0x5b9cca4f);
    uVar22 = b;
    uVar18 = f;
    uVar55 = uVar42 >> 10 ^ (uVar42 * 0x2000 | uVar42 >> 0x13) ^ (uVar42 * 0x8000 | uVar42 >> 0x11);
    iVar56 = (uVar45 >> 3 ^ (uVar45 * 0x4000 | uVar45 >> 0x12) ^ (uVar45 * 0x2000000 | uVar45 >> 7))
             + uVar44 + uVar53;
    uVar44 = iVar56 + uVar55;
    Round(b,uVar21,uVar20,&e,f,uVar17,uVar16,&a,uVar55 + iVar56 + 0x682e6ff3);
    uVar23 = a;
    uVar19 = e;
    uVar55 = uVar43 >> 10 ^ (uVar43 * 0x2000 | uVar43 >> 0x13) ^ (uVar43 * 0x8000 | uVar43 >> 0x11);
    iVar56 = (uVar46 >> 3 ^ (uVar46 * 0x4000 | uVar46 >> 0x12) ^ (uVar46 * 0x2000000 | uVar46 >> 7))
             + uVar45 + uVar54;
    uVar45 = iVar56 + uVar55;
    Round(a,uVar22,uVar21,&d,e,uVar18,uVar17,&h,uVar55 + iVar56 + 0x748f82ee);
    uVar20 = d;
    uVar16 = h;
    uVar54 = uVar44 >> 10 ^ (uVar44 * 0x2000 | uVar44 >> 0x13) ^ (uVar44 * 0x8000 | uVar44 >> 0x11);
    iVar56 = (uVar47 >> 3 ^ (uVar47 * 0x4000 | uVar47 >> 0x12) ^ (uVar47 * 0x2000000 | uVar47 >> 7))
             + uVar46 + uVar39;
    uVar39 = iVar56 + uVar54;
    Round(h,uVar23,uVar22,&c,d,uVar19,uVar18,&g,uVar54 + iVar56 + 0x78a5636f);
    uVar21 = c;
    uVar17 = g;
    uVar46 = uVar45 >> 10 ^ (uVar45 * 0x2000 | uVar45 >> 0x13) ^ (uVar45 * 0x8000 | uVar45 >> 0x11);
    iVar56 = (uVar48 >> 3 ^ (uVar48 * 0x4000 | uVar48 >> 0x12) ^ (uVar48 * 0x2000000 | uVar48 >> 7))
             + uVar47 + uVar40;
    uVar40 = iVar56 + uVar46;
    Round(g,uVar16,uVar23,&b,c,uVar20,uVar19,&f,uVar46 + iVar56 + 0x84c87814);
    uVar22 = b;
    uVar18 = f;
    uVar46 = uVar39 >> 10 ^ (uVar39 * 0x2000 | uVar39 >> 0x13) ^ (uVar39 * 0x8000 | uVar39 >> 0x11);
    iVar56 = (uVar49 >> 3 ^ (uVar49 * 0x4000 | uVar49 >> 0x12) ^ (uVar49 * 0x2000000 | uVar49 >> 7))
             + uVar48 + uVar41;
    uVar39 = iVar56 + uVar46;
    Round(f,uVar17,uVar16,&a,b,uVar21,uVar20,&e,iVar56 + uVar46 + 0x8cc70208);
    uVar23 = a;
    uVar19 = e;
    uVar41 = uVar40 >> 10 ^ (uVar40 * 0x2000 | uVar40 >> 0x13) ^ (uVar40 * 0x8000 | uVar40 >> 0x11);
    iVar56 = (uVar50 >> 3 ^ (uVar50 * 0x4000 | uVar50 >> 0x12) ^ (uVar50 * 0x2000000 | uVar50 >> 7))
             + uVar49 + uVar42;
    uVar40 = iVar56 + uVar41;
    Round(e,uVar18,uVar17,&h,a,uVar22,uVar21,&d,iVar56 + uVar41 + 0x90befffa);
    uVar20 = d;
    uVar16 = h;
    uVar41 = uVar39 >> 10 ^ (uVar39 * 0x2000 | uVar39 >> 0x13) ^ (uVar39 * 0x8000 | uVar39 >> 0x11);
    iVar56 = (uVar51 >> 3 ^ (uVar51 * 0x4000 | uVar51 >> 0x12) ^ (uVar51 * 0x2000000 | uVar51 >> 7))
             + uVar50 + uVar43;
    uVar39 = iVar56 + uVar41;
    Round(d,uVar19,uVar18,&g,h,uVar23,uVar22,&c,iVar56 + uVar41 + 0xa4506ceb);
    uVar21 = c;
    uVar17 = g;
    Round(c,uVar20,uVar19,&f,g,uVar16,uVar23,&b,
          (uVar52 >> 3 ^ (uVar52 * 0x4000 | uVar52 >> 0x12) ^ (uVar52 * 0x2000000 | uVar52 >> 7)) +
          uVar51 + uVar44 +
          (uVar40 >> 10 ^ (uVar40 * 0x2000 | uVar40 >> 0x13) ^ (uVar40 * 0x8000 | uVar40 >> 0x11)) +
          0xbef9a3f7);
    uVar19 = b;
    uVar18 = f;
    Round(b,uVar21,uVar20,&e,f,uVar17,uVar16,&a,
          (uVar53 >> 3 ^ (uVar53 * 0x4000 | uVar53 >> 0x12) ^ (uVar53 * 0x2000000 | uVar53 >> 7)) +
          uVar52 + uVar45 +
          (uVar39 >> 10 ^ (uVar39 * 0x2000 | uVar39 >> 0x13) ^ (uVar39 * 0x8000 | uVar39 >> 0x11)) +
          0xc67178f2);
    *s = a_00 + a;
    s[1] = uVar19 + b_00;
    s[2] = uVar21 + c_00;
    s[3] = uVar20 + uVar1;
    s[4] = e_00 + e;
    s[5] = uVar18 + f_00;
    s[6] = uVar17 + g_00;
    s[7] = uVar16 + uVar2;
    chunk = (uchar *)((long)chunk + 0x40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Transform(uint32_t* s, const unsigned char* chunk, size_t blocks)
{
    while (blocks--) {
        uint32_t a = s[0], b = s[1], c = s[2], d = s[3], e = s[4], f = s[5], g = s[6], h = s[7];
        uint32_t w0, w1, w2, w3, w4, w5, w6, w7, w8, w9, w10, w11, w12, w13, w14, w15;

        Round(a, b, c, d, e, f, g, h, 0x428a2f98 + (w0 = ReadBE32(chunk + 0)));
        Round(h, a, b, c, d, e, f, g, 0x71374491 + (w1 = ReadBE32(chunk + 4)));
        Round(g, h, a, b, c, d, e, f, 0xb5c0fbcf + (w2 = ReadBE32(chunk + 8)));
        Round(f, g, h, a, b, c, d, e, 0xe9b5dba5 + (w3 = ReadBE32(chunk + 12)));
        Round(e, f, g, h, a, b, c, d, 0x3956c25b + (w4 = ReadBE32(chunk + 16)));
        Round(d, e, f, g, h, a, b, c, 0x59f111f1 + (w5 = ReadBE32(chunk + 20)));
        Round(c, d, e, f, g, h, a, b, 0x923f82a4 + (w6 = ReadBE32(chunk + 24)));
        Round(b, c, d, e, f, g, h, a, 0xab1c5ed5 + (w7 = ReadBE32(chunk + 28)));
        Round(a, b, c, d, e, f, g, h, 0xd807aa98 + (w8 = ReadBE32(chunk + 32)));
        Round(h, a, b, c, d, e, f, g, 0x12835b01 + (w9 = ReadBE32(chunk + 36)));
        Round(g, h, a, b, c, d, e, f, 0x243185be + (w10 = ReadBE32(chunk + 40)));
        Round(f, g, h, a, b, c, d, e, 0x550c7dc3 + (w11 = ReadBE32(chunk + 44)));
        Round(e, f, g, h, a, b, c, d, 0x72be5d74 + (w12 = ReadBE32(chunk + 48)));
        Round(d, e, f, g, h, a, b, c, 0x80deb1fe + (w13 = ReadBE32(chunk + 52)));
        Round(c, d, e, f, g, h, a, b, 0x9bdc06a7 + (w14 = ReadBE32(chunk + 56)));
        Round(b, c, d, e, f, g, h, a, 0xc19bf174 + (w15 = ReadBE32(chunk + 60)));

        Round(a, b, c, d, e, f, g, h, 0xe49b69c1 + (w0 += sigma1(w14) + w9 + sigma0(w1)));
        Round(h, a, b, c, d, e, f, g, 0xefbe4786 + (w1 += sigma1(w15) + w10 + sigma0(w2)));
        Round(g, h, a, b, c, d, e, f, 0x0fc19dc6 + (w2 += sigma1(w0) + w11 + sigma0(w3)));
        Round(f, g, h, a, b, c, d, e, 0x240ca1cc + (w3 += sigma1(w1) + w12 + sigma0(w4)));
        Round(e, f, g, h, a, b, c, d, 0x2de92c6f + (w4 += sigma1(w2) + w13 + sigma0(w5)));
        Round(d, e, f, g, h, a, b, c, 0x4a7484aa + (w5 += sigma1(w3) + w14 + sigma0(w6)));
        Round(c, d, e, f, g, h, a, b, 0x5cb0a9dc + (w6 += sigma1(w4) + w15 + sigma0(w7)));
        Round(b, c, d, e, f, g, h, a, 0x76f988da + (w7 += sigma1(w5) + w0 + sigma0(w8)));
        Round(a, b, c, d, e, f, g, h, 0x983e5152 + (w8 += sigma1(w6) + w1 + sigma0(w9)));
        Round(h, a, b, c, d, e, f, g, 0xa831c66d + (w9 += sigma1(w7) + w2 + sigma0(w10)));
        Round(g, h, a, b, c, d, e, f, 0xb00327c8 + (w10 += sigma1(w8) + w3 + sigma0(w11)));
        Round(f, g, h, a, b, c, d, e, 0xbf597fc7 + (w11 += sigma1(w9) + w4 + sigma0(w12)));
        Round(e, f, g, h, a, b, c, d, 0xc6e00bf3 + (w12 += sigma1(w10) + w5 + sigma0(w13)));
        Round(d, e, f, g, h, a, b, c, 0xd5a79147 + (w13 += sigma1(w11) + w6 + sigma0(w14)));
        Round(c, d, e, f, g, h, a, b, 0x06ca6351 + (w14 += sigma1(w12) + w7 + sigma0(w15)));
        Round(b, c, d, e, f, g, h, a, 0x14292967 + (w15 += sigma1(w13) + w8 + sigma0(w0)));

        Round(a, b, c, d, e, f, g, h, 0x27b70a85 + (w0 += sigma1(w14) + w9 + sigma0(w1)));
        Round(h, a, b, c, d, e, f, g, 0x2e1b2138 + (w1 += sigma1(w15) + w10 + sigma0(w2)));
        Round(g, h, a, b, c, d, e, f, 0x4d2c6dfc + (w2 += sigma1(w0) + w11 + sigma0(w3)));
        Round(f, g, h, a, b, c, d, e, 0x53380d13 + (w3 += sigma1(w1) + w12 + sigma0(w4)));
        Round(e, f, g, h, a, b, c, d, 0x650a7354 + (w4 += sigma1(w2) + w13 + sigma0(w5)));
        Round(d, e, f, g, h, a, b, c, 0x766a0abb + (w5 += sigma1(w3) + w14 + sigma0(w6)));
        Round(c, d, e, f, g, h, a, b, 0x81c2c92e + (w6 += sigma1(w4) + w15 + sigma0(w7)));
        Round(b, c, d, e, f, g, h, a, 0x92722c85 + (w7 += sigma1(w5) + w0 + sigma0(w8)));
        Round(a, b, c, d, e, f, g, h, 0xa2bfe8a1 + (w8 += sigma1(w6) + w1 + sigma0(w9)));
        Round(h, a, b, c, d, e, f, g, 0xa81a664b + (w9 += sigma1(w7) + w2 + sigma0(w10)));
        Round(g, h, a, b, c, d, e, f, 0xc24b8b70 + (w10 += sigma1(w8) + w3 + sigma0(w11)));
        Round(f, g, h, a, b, c, d, e, 0xc76c51a3 + (w11 += sigma1(w9) + w4 + sigma0(w12)));
        Round(e, f, g, h, a, b, c, d, 0xd192e819 + (w12 += sigma1(w10) + w5 + sigma0(w13)));
        Round(d, e, f, g, h, a, b, c, 0xd6990624 + (w13 += sigma1(w11) + w6 + sigma0(w14)));
        Round(c, d, e, f, g, h, a, b, 0xf40e3585 + (w14 += sigma1(w12) + w7 + sigma0(w15)));
        Round(b, c, d, e, f, g, h, a, 0x106aa070 + (w15 += sigma1(w13) + w8 + sigma0(w0)));

        Round(a, b, c, d, e, f, g, h, 0x19a4c116 + (w0 += sigma1(w14) + w9 + sigma0(w1)));
        Round(h, a, b, c, d, e, f, g, 0x1e376c08 + (w1 += sigma1(w15) + w10 + sigma0(w2)));
        Round(g, h, a, b, c, d, e, f, 0x2748774c + (w2 += sigma1(w0) + w11 + sigma0(w3)));
        Round(f, g, h, a, b, c, d, e, 0x34b0bcb5 + (w3 += sigma1(w1) + w12 + sigma0(w4)));
        Round(e, f, g, h, a, b, c, d, 0x391c0cb3 + (w4 += sigma1(w2) + w13 + sigma0(w5)));
        Round(d, e, f, g, h, a, b, c, 0x4ed8aa4a + (w5 += sigma1(w3) + w14 + sigma0(w6)));
        Round(c, d, e, f, g, h, a, b, 0x5b9cca4f + (w6 += sigma1(w4) + w15 + sigma0(w7)));
        Round(b, c, d, e, f, g, h, a, 0x682e6ff3 + (w7 += sigma1(w5) + w0 + sigma0(w8)));
        Round(a, b, c, d, e, f, g, h, 0x748f82ee + (w8 += sigma1(w6) + w1 + sigma0(w9)));
        Round(h, a, b, c, d, e, f, g, 0x78a5636f + (w9 += sigma1(w7) + w2 + sigma0(w10)));
        Round(g, h, a, b, c, d, e, f, 0x84c87814 + (w10 += sigma1(w8) + w3 + sigma0(w11)));
        Round(f, g, h, a, b, c, d, e, 0x8cc70208 + (w11 += sigma1(w9) + w4 + sigma0(w12)));
        Round(e, f, g, h, a, b, c, d, 0x90befffa + (w12 += sigma1(w10) + w5 + sigma0(w13)));
        Round(d, e, f, g, h, a, b, c, 0xa4506ceb + (w13 += sigma1(w11) + w6 + sigma0(w14)));
        Round(c, d, e, f, g, h, a, b, 0xbef9a3f7 + (w14 + sigma1(w12) + w7 + sigma0(w15)));
        Round(b, c, d, e, f, g, h, a, 0xc67178f2 + (w15 + sigma1(w13) + w8 + sigma0(w0)));

        s[0] += a;
        s[1] += b;
        s[2] += c;
        s[3] += d;
        s[4] += e;
        s[5] += f;
        s[6] += g;
        s[7] += h;
        chunk += 64;
    }
}